

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigSavePattern3(Ivy_FraigMan_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int i;
  int iVar5;
  long lVar6;
  
  for (lVar6 = 0; lVar6 < p->nPatWords; lVar6 = lVar6 + 1) {
    uVar1 = Ivy_ObjRandomSim();
    p->pPatWords[lVar6] = uVar1;
  }
  i = 0;
  while( true ) {
    if (p->vPiVars->nSize <= i) {
      return;
    }
    piVar3 = (int *)Vec_PtrEntry(p->vPiVars,i);
    iVar5 = (int)(*piVar3 - 1U) >> 5;
    uVar1 = p->pPatWords[iVar5];
    uVar4 = *piVar3 - 1U & 0x1f;
    uVar2 = (uint)*(undefined8 *)(piVar3 + 10);
    if (((int)uVar2 < 0) || (p->pSat->size <= (int)uVar2)) break;
    if (((p->pSat->model[uVar2 & 0x7fffffff] != 1 ^ (byte)(uVar1 >> (sbyte)uVar4)) & 1) == 0) {
      p->pPatWords[iVar5] = uVar1 ^ 1 << uVar4;
    }
    i = i + 1;
  }
  __assert_fail("v >= 0 && v < s->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
}

Assistant:

void Ivy_FraigSavePattern3( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < p->nPatWords; i++ )
        p->pPatWords[i] = Ivy_ObjRandomSim();
    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ (p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True) )
        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ sat_solver_var_value(p->pSat, Ivy_ObjSatNum(pObj)) )
            Ivy_InfoXorBit( p->pPatWords, pObj->Id - 1 );
}